

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

bool anon_unknown.dwarf_2398caa::CheckGenExParameters
               (cmGeneratorExpressionContext *ctx,GeneratorExpressionContent *cnt,string_view genex,
               string_view option,size_t count,int required,bool exactly)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  cmGeneratorExpressionContext *local_1f8;
  string local_1f0;
  string local_1d0;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  undefined1 local_198 [32];
  undefined8 local_178;
  undefined8 local_170;
  undefined1 *local_168;
  undefined1 local_160 [32];
  undefined8 local_140;
  undefined8 local_138;
  undefined1 *local_130;
  undefined1 local_128 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_108;
  size_t local_f0;
  char *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  long local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  if (required < (int)count && exactly || required > (int)count) {
    local_218 = &local_208;
    local_210 = 0;
    local_208 = 0;
    local_1f8 = ctx;
    std::__cxx11::string::_M_replace
              ((ulong)&local_218,0,(char *)0x0,
               (ulong)(&DAT_008f1c74 +
                      *(int *)(
                              "ZZNK8ListNode8EvaluateERKSt6vectorINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESaIS6_EEP28cmGeneratorExpressionContextPK26GeneratorExpressionContentP31cmGeneratorExpressionDAGCheckerENKUlSC_SF_RN12_GLOBAL__N_15RangeIS8_EEE13_clB5cxx11ESC_SF_SL_EUlRKS6_SO_E_"
                              + (long)required * 4 + 0x109)));
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1d0,cnt);
    local_88 = "at least";
    if (exactly) {
      local_88 = "exactly";
    }
    local_108.first._M_len = 2;
    local_108.first._M_str = "$<";
    local_108.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_e0 = 0;
    local_130 = local_128;
    local_140 = 0;
    local_138 = 1;
    local_128[0] = 0x3a;
    local_d8 = 1;
    local_c8 = 0;
    local_b0 = 0;
    local_a8 = 0x16;
    local_a0 = "> expression requires ";
    local_98 = 0;
    local_90 = 8 - (ulong)exactly;
    local_80 = 0;
    local_168 = local_160;
    local_178 = 0;
    local_170 = 1;
    local_160[0] = 0x20;
    local_78 = 1;
    local_68 = 0;
    local_60 = local_210;
    local_58 = local_218;
    local_50 = 0;
    local_1a0 = local_198;
    local_1b0 = 0;
    local_1a8 = 1;
    local_198[0] = 0x2e;
    local_48 = 1;
    local_38 = 0;
    views._M_len = 9;
    views._M_array = &local_108;
    local_f0 = genex._M_len;
    local_e8 = genex._M_str;
    local_d0 = local_130;
    local_c0 = option._M_len;
    local_b8 = option._M_str;
    local_70 = local_168;
    local_40 = local_1a0;
    cmCatViews(&local_1f0,views);
    reportError(local_1f8,&local_1d0,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
    }
  }
  return (required >= (int)count || !exactly) && required <= (int)count;
}

Assistant:

bool CheckGenExParameters(cmGeneratorExpressionContext* ctx,
                          const GeneratorExpressionContent* cnt,
                          cm::string_view genex, cm::string_view option,
                          std::size_t count, int required = 1,
                          bool exactly = true)
{
  if (static_cast<int>(count) < required ||
      (exactly && static_cast<int>(count) > required)) {
    std::string nbParameters;
    switch (required) {
      case 1:
        nbParameters = "one parameter";
        break;
      case 2:
        nbParameters = "two parameters";
        break;
      case 3:
        nbParameters = "three parameters";
        break;
      case 4:
        nbParameters = "four parameters";
        break;
      default:
        nbParameters = cmStrCat(std::to_string(required), " parameters");
    }
    reportError(ctx, cnt->GetOriginalExpression(),
                cmStrCat("$<", genex, ':', option, "> expression requires ",
                         (exactly ? "exactly" : "at least"), ' ', nbParameters,
                         '.'));
    return false;
  }
  return true;
}